

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * Fantasy_ReorderedEnum_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  uint64_t w;
  char *mark;
  char *unmatched;
  int *aggregate_local;
  uint64_t *value_local;
  int *value_sign_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if (uVar1 < 0x7279000000000000) {
    if ((uVar1 & 0xffff000000000000) != 0x7278000000000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,2,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 10;
    *value_sign = 0;
  }
  else if ((uVar1 & 0xffff000000000000) == 0x727a000000000000) {
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,2,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 9;
    *value_sign = 0;
  }
  else {
    if ((uVar1 & 0xffff000000000000) != 0x7279000000000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,2,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 1;
    *value_sign = 0;
  }
  return end_local;
}

Assistant:

static const char *Fantasy_ReorderedEnum_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x7279000000000000) { /* branch "ry" */
        if ((w & 0xffff000000000000) == 0x7278000000000000) { /* "rx" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 2, aggregate);
            if (buf != mark) {
                *value = UINT64_C(10), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "rx" */
            return unmatched;
        } /* "rx" */
    } else { /* branch "ry" */
        if ((w & 0xffff000000000000) == 0x727a000000000000) { /* "rz" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 2, aggregate);
            if (buf != mark) {
                *value = UINT64_C(9), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "rz" */
            if ((w & 0xffff000000000000) == 0x7279000000000000) { /* "ry" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 2, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(1), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "ry" */
                return unmatched;
            } /* "ry" */
        } /* "rz" */
    } /* branch "ry" */
    return buf;
}